

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O0

void __thiscall mathOps_preciseFixedMeas_Test::TestBody(mathOps_preciseFixedMeas_Test *this)

{
  bool bVar1;
  char *pcVar2;
  fixed_precise_measurement *measure;
  fixed_precise_measurement *measure_00;
  fixed_precise_measurement *measure_01;
  fixed_precise_measurement *measure_02;
  fixed_precise_measurement *measure_03;
  double in_XMM0_Qa;
  double dVar3;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  AssertHelper local_178;
  Message local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_4;
  fixed_precise_measurement um6;
  Message local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_3;
  fixed_precise_measurement um5;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_2;
  fixed_precise_measurement um4;
  Message local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  fixed_precise_measurement um3;
  Message local_90 [3];
  fixed_precise_measurement local_78;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  fixed_precise_measurement um2;
  undefined1 local_28 [8];
  fixed_precise_measurement um1;
  mathOps_preciseFixedMeas_Test *this_local;
  
  um1.units_._8_8_ = this;
  um2.units_._8_8_ =
       units::precise_unit::pow
                 ((precise_unit *)units::precise::m,in_XMM0_Qa,
                  (double)CONCAT44(in_XMM1_Db,in_XMM1_Da));
  units::fixed_precise_measurement::fixed_precise_measurement
            ((fixed_precise_measurement *)local_28,5.69,(precise_unit *)&um2.units_.base_units_);
  units::cbrt<units::fixed_precise_measurement,void>
            ((fixed_precise_measurement *)&gtest_ar.message_,(units *)local_28,measure);
  units::root(&local_78,(fixed_precise_measurement *)local_28,3);
  testing::internal::EqHelper::
  Compare<units::fixed_precise_measurement,_units::fixed_precise_measurement,_nullptr>
            ((EqHelper *)local_60,"um2","root(um1, 3)",
             (fixed_precise_measurement *)&gtest_ar.message_,&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&um3.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x6a,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&um3.units_.base_units_,local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&um3.units_.base_units_);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  units::floor<units::fixed_precise_measurement,void>
            ((fixed_precise_measurement *)&gtest_ar_1.message_,(units *)local_28,measure_00);
  dVar3 = units::fixed_precise_measurement::value((fixed_precise_measurement *)&gtest_ar_1.message_)
  ;
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_c0,"um3.value()","5.0F",(float)dVar3,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&um4.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x6d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&um4.units_.base_units_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&um4.units_.base_units_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  units::trunc<units::fixed_precise_measurement,void>
            ((fixed_precise_measurement *)&gtest_ar_2.message_,(units *)local_28,measure_01);
  dVar3 = units::fixed_precise_measurement::value((fixed_precise_measurement *)&gtest_ar_2.message_)
  ;
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_f8,"um4.value()","5.0F",(float)dVar3,5.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_100);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&um5.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x70,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&um5.units_.base_units_,&local_100);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&um5.units_.base_units_);
    testing::Message::~Message(&local_100);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  units::ceil<units::fixed_precise_measurement,void>
            ((fixed_precise_measurement *)&gtest_ar_3.message_,(units *)local_28,measure_02);
  dVar3 = units::fixed_precise_measurement::value((fixed_precise_measurement *)&gtest_ar_3.message_)
  ;
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_130,"um5.value()","6.0F",(float)dVar3,6.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&um6.units_.base_units_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x73,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&um6.units_.base_units_,&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&um6.units_.base_units_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  units::round<units::fixed_precise_measurement,void>
            ((fixed_precise_measurement *)&gtest_ar_4.message_,(units *)local_28,measure_03);
  dVar3 = units::fixed_precise_measurement::value((fixed_precise_measurement *)&gtest_ar_4.message_)
  ;
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)local_168,"um6.value()","6.0F",(float)dVar3,6.0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_math.cpp",
               0x76,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  return;
}

Assistant:

TEST(mathOps, preciseFixedMeas)
{
    fixed_precise_measurement um1(5.69, precise::m.pow(3));

    auto um2 = cbrt(um1);
    EXPECT_EQ(um2, root(um1, 3));

    auto um3 = floor(um1);
    EXPECT_FLOAT_EQ(um3.value(), 5.0F);

    auto um4 = trunc(um1);
    EXPECT_FLOAT_EQ(um4.value(), 5.0F);

    auto um5 = ceil(um1);
    EXPECT_FLOAT_EQ(um5.value(), 6.0F);

    auto um6 = round(um1);
    EXPECT_FLOAT_EQ(um6.value(), 6.0F);
}